

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O0

float sensitivity(ftrl *b,base_learner *param_2,example *ec)

{
  ftrl *in_RDI;
  uncertainty uncetain;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  vw *in_stack_ffffffffffffffe0;
  
  uncertainty::uncertainty((uncertainty *)&stack0xffffffffffffffd8,in_RDI);
  GD::foreach_feature<uncertainty,_&predict_with_confidence>
            (in_stack_ffffffffffffffe0,
             (example *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (uncertainty *)0x2d2225);
  return in_stack_ffffffffffffffdc;
}

Assistant:

float sensitivity(ftrl& b, base_learner& /* base */, example& ec)
{
  uncertainty uncetain(b);
  GD::foreach_feature<uncertainty, predict_with_confidence>(*(b.all), ec, uncetain);
  return uncetain.score;
}